

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68020_mull(void)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  uint in_EDI;
  bool bVar4;
  
  if (((byte)g_cpu_type & 0x1c) == 0) {
    if ((~g_cpu_ir & 0xf000) == 0) {
      d68000_1111();
      return;
    }
    d68000_illegal();
    return;
  }
  uVar1 = dasm_read_imm_16(in_EDI);
  bVar4 = (uVar1 >> 0xb & 1) == 0;
  pcVar2 = get_ea_mode_str(g_cpu_ir,2);
  uVar3 = (ulong)(bVar4 + 0x73 + (uint)bVar4);
  if ((uVar1 >> 10 & 1) == 0) {
    sprintf(g_dasm_str,"mul%c.l  %s, D%d; (2+)",uVar3,pcVar2,(ulong)(uVar1 >> 0xc & 7));
    return;
  }
  sprintf(g_dasm_str,"mul%c.l  %s, D%d:D%d; (2+)",uVar3,pcVar2,(ulong)(uVar1 & 7),
          (ulong)(uVar1 >> 0xc & 7));
  return;
}

Assistant:

static void d68020_mull(void)
{
	uint extension;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension = read_imm_16();

	if(BIT_A(extension))
		sprintf(g_dasm_str, "mul%c.l  %s, D%d:D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), extension&7, (extension>>12)&7);
	else
		sprintf(g_dasm_str, "mul%c.l  %s, D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), (extension>>12)&7);
}